

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void __thiscall QGuiApplicationPrivate::~QGuiApplicationPrivate(QGuiApplicationPrivate *this)

{
  ulong uVar1;
  QOpenGLContext *pQVar2;
  QList<QObject_*> *ctx;
  ulong uVar3;
  
  *(undefined ***)this = &PTR__QGuiApplicationPrivate_0077d7b0;
  QCoreApplicationPrivate::is_app_closing._0_1_ = 1;
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  uVar1 = generic_plugin_list.d.size;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    if (generic_plugin_list.d.ptr[uVar3] != (QObject *)0x0) {
      (**(code **)(*(long *)generic_plugin_list.d.ptr[uVar3] + 0x20))();
      uVar1 = generic_plugin_list.d.size;
    }
  }
  ctx = &generic_plugin_list;
  QList<QObject_*>::clear(&generic_plugin_list);
  clearFontUnlocked();
  QFont::cleanup((EVP_PKEY_CTX *)ctx);
  QCursorData::cleanup((EVP_PKEY_CTX *)ctx);
  layout_direction = LayoutDirectionAuto;
  QCoreApplicationPrivate::cleanupThreadData();
  if (styleHints != (QStyleHints *)0x0) {
    (**(code **)(*(long *)styleHints + 0x20))();
  }
  styleHints = (QStyleHints *)0x0;
  if (this->inputMethod != (QInputMethod *)0x0) {
    (**(code **)(*(long *)this->inputMethod + 0x20))();
  }
  qt_cleanupFontDatabase();
  QPixmapCache::clear();
  if (this->ownGlobalShareContext == true) {
    pQVar2 = qt_gl_global_share_context();
    if (pQVar2 != (QOpenGLContext *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
    qt_gl_set_global_share_context((QOpenGLContext *)0x0);
  }
  (*platform_integration->_vptr_QPlatformIntegration[0xc])();
  if (platform_theme != (QPlatformTheme *)0x0) {
    (*platform_theme->_vptr_QPlatformTheme[1])();
  }
  platform_theme = (QPlatformTheme *)0x0;
  if (platform_integration != (QPlatformIntegration *)0x0) {
    (*platform_integration->_vptr_QPlatformIntegration[1])();
  }
  platform_integration = (QPlatformIntegration *)0x0;
  QList<QWindow_*>::clear(&window_list);
  QList<QWindow_*>::clear(&popup_list);
  QList<QScreen_*>::clear(&screen_list);
  self = (QGuiApplicationPrivate *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_a32ColorProfile).super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
            (&this->synthesizedMousePoints);
  QShortcutMap::~QShortcutMap(&this->shortcutMap);
  QIcon::~QIcon(&this->forcedWindowIcon);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->firstWindowTitle).d);
  QArrayDataPointer<QCursor>::~QArrayDataPointer(&(this->cursor_list).d);
  QArrayDataPointer<QWindow_*>::~QArrayDataPointer(&(this->modalWindowList).d);
  QCoreApplicationPrivate::~QCoreApplicationPrivate(&this->super_QCoreApplicationPrivate);
  return;
}

Assistant:

QGuiApplicationPrivate::~QGuiApplicationPrivate()
{
    is_app_closing = true;
    is_app_running = false;

    for (int i = 0; i < generic_plugin_list.size(); ++i)
        delete generic_plugin_list.at(i);
    generic_plugin_list.clear();

    clearFontUnlocked();

    QFont::cleanup();

#ifndef QT_NO_CURSOR
    QCursorData::cleanup();
#endif

    layout_direction = Qt::LayoutDirectionAuto;

    cleanupThreadData();

    delete QGuiApplicationPrivate::styleHints;
    QGuiApplicationPrivate::styleHints = nullptr;
    delete inputMethod;

    qt_cleanupFontDatabase();

    QPixmapCache::clear();

#ifndef QT_NO_OPENGL
    if (ownGlobalShareContext) {
        delete qt_gl_global_share_context();
        qt_gl_set_global_share_context(nullptr);
    }
#endif

#if QT_CONFIG(vulkan)
    QVulkanDefaultInstance::cleanup();
#endif

    platform_integration->destroy();

    delete platform_theme;
    platform_theme = nullptr;
    delete platform_integration;
    platform_integration = nullptr;

    window_list.clear();
    popup_list.clear();
    screen_list.clear();

    self = nullptr;
}